

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int header_set_priority(HEADER_HANDLE header,uint8_t priority_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  HEADER_INSTANCE *header_instance;
  
  if (header == (HEADER_HANDLE)0x0) {
    iVar2 = 0x3a5b;
  }
  else {
    item_value = amqpvalue_create_ubyte(priority_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x3a63;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(header->composite_value,1,item_value);
      iVar2 = 0x3a69;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int header_set_priority(HEADER_HANDLE header, uint8_t priority_value)
{
    int result;

    if (header == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        HEADER_INSTANCE* header_instance = (HEADER_INSTANCE*)header;
        AMQP_VALUE priority_amqp_value = amqpvalue_create_ubyte(priority_value);
        if (priority_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(header_instance->composite_value, 1, priority_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(priority_amqp_value);
        }
    }

    return result;
}